

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall checkqueue_tests::test_CheckQueue_Memory::test_method(test_CheckQueue_Memory *this)

{
  int iVar1;
  long in_FS_OFFSET;
  size_t k;
  size_t r;
  size_t total;
  size_t i;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object queue;
  CCheckQueueControl<MemoryCheck> control;
  char *in_stack_fffffffffffffed8;
  __native_type *in_stack_fffffffffffffee0;
  basic_cstring<const_char> *in_stack_fffffffffffffee8;
  bool *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  lazy_ostream *in_stack_ffffffffffffff08;
  uint *in_stack_ffffffffffffff10;
  const_string *file;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  ulong local_d0;
  ulong local_b0;
  ulong local_a8;
  __native_type local_94 [2];
  undefined1 local_39;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<MemoryCheck>,unsigned_int_const&,int_const&>
            (in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
  for (local_a8 = 0; local_a8 < 1000; local_a8 = local_a8 + 1) {
    local_b0 = local_a8;
    std::unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>::get
              ((unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
                *)in_stack_fffffffffffffed8);
    CCheckQueueControl<MemoryCheck>::CCheckQueueControl
              ((CCheckQueueControl<MemoryCheck> *)in_stack_fffffffffffffee8,
               (CCheckQueue<FakeCheckCheckCompletion> *)&in_stack_fffffffffffffee0->__data);
    while (local_b0 != 0) {
      iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffefc);
      std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffed8);
      for (local_d0 = 0; in_stack_ffffffffffffff1f = local_d0 < (ulong)(long)iVar1 && local_b0 != 0,
          local_d0 < (ulong)(long)iVar1 && local_b0 != 0; local_d0 = local_d0 + 1) {
        local_b0 = local_b0 - 1;
        in_stack_ffffffffffffff1e = true;
        if ((local_b0 != 0) && (in_stack_ffffffffffffff1e = true, local_b0 != local_a8)) {
          in_stack_ffffffffffffff1e = local_b0 == local_a8 >> 1;
        }
        local_39 = in_stack_ffffffffffffff1e;
        std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::emplace_back<bool>
                  ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
      }
      CCheckQueueControl<MemoryCheck>::Add
                ((CCheckQueueControl<MemoryCheck> *)in_stack_fffffffffffffee8,
                 (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 &in_stack_fffffffffffffee0->__data);
      std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffee8);
    }
    CCheckQueueControl<MemoryCheck>::~CCheckQueueControl
              ((CCheckQueueControl<MemoryCheck> *)in_stack_fffffffffffffee8);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->__size,
                 (unsigned_long)in_stack_fffffffffffffed8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffed8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)
                 CONCAT17(in_stack_ffffffffffffff1f,
                          CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),file,
                 (size_t)in_stack_ffffffffffffff08,
                 (const_string *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      in_stack_ffffffffffffff08 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffffee0->__data,
                 (char (*) [1])in_stack_fffffffffffffed8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->__size,
                 (unsigned_long)in_stack_fffffffffffffed8);
      local_94[0].__data.__lock = 0;
      in_stack_fffffffffffffee8 = (basic_cstring<const_char> *)0x1c66917;
      in_stack_fffffffffffffee0 = local_94;
      in_stack_fffffffffffffed8 = "MemoryCheck::fake_allocated_memory";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<unsigned_long>,unsigned_int>
                (&local_94[0].__data.__spins,&local_94[0].__data.__count,0x13e,2,2,
                 &MemoryCheck::fake_allocated_memory);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffed8);
      in_stack_ffffffffffffff07 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffff07);
  }
  std::unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
               *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Memory)
{
    auto queue = std::make_unique<Memory_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1000; ++i) {
        size_t total = i;
        {
            CCheckQueueControl<MemoryCheck> control(queue.get());
            while (total) {
                size_t r = m_rng.randrange(10);
                std::vector<MemoryCheck> vChecks;
                for (size_t k = 0; k < r && total; k++) {
                    total--;
                    // Each iteration leaves data at the front, back, and middle
                    // to catch any sort of deallocation failure
                    vChecks.emplace_back(total == 0 || total == i || total == i/2);
                }
                control.Add(std::move(vChecks));
            }
        }
        BOOST_REQUIRE_EQUAL(MemoryCheck::fake_allocated_memory, 0U);
    }
}